

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O1

JSON_Value * json_value_init_string_with_len(char *string,size_t length)

{
  byte bVar1;
  char *__dest;
  JSON_Value *pJVar2;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  if (string != (char *)0x0) {
    if (0 < (long)length) {
      pbVar3 = (byte *)string;
      do {
        bVar1 = *pbVar3;
        uVar6 = (uint)bVar1;
        uVar5 = 0;
        if ((((((bVar1 & 0xc0) != 0x80 && (bVar1 & 0xfe) != 0xc0) && bVar1 < 0xf5) &&
             (uVar5 = 1, (char)bVar1 < '\0')) && (uVar5 = 2, (bVar1 & 0xe0) != 0xc0)) &&
           (uVar5 = 3, (bVar1 & 0xf0) != 0xe0)) {
          uVar5 = (uint)((bVar1 & 0xf8) == 0xf0) << 2;
        }
        if (3 < uVar5 - 1) {
          return (JSON_Value *)0x0;
        }
        uVar4 = (uint)bVar1;
        switch(uVar5) {
        case 2:
          if ((pbVar3[1] & 0xffffffc0) != 0x80) {
            if (uVar5 != 4) {
              if (uVar5 != 3) {
                return (JSON_Value *)0x0;
              }
              goto switchD_0018c19c_caseD_3;
            }
            goto switchD_0018c19c_caseD_4;
          }
          uVar6 = (uVar4 & 0x1f) << 6 | pbVar3[1] & 0x3f;
          break;
        case 3:
switchD_0018c19c_caseD_3:
          if (((pbVar3[1] & 0xffffffc0) != 0x80) || ((pbVar3[2] & 0xffffffc0) != 0x80)) {
            if (uVar5 != 4) {
              return (JSON_Value *)0x0;
            }
            goto switchD_0018c19c_caseD_4;
          }
          uVar6 = pbVar3[2] & 0x3f | (pbVar3[1] & 0x3f) << 6 | (uVar4 & 0xf) << 0xc;
          break;
        case 4:
switchD_0018c19c_caseD_4:
          if ((pbVar3[1] & 0xffffffc0) != 0x80) {
            return (JSON_Value *)0x0;
          }
          if ((pbVar3[2] & 0xffffffc0) != 0x80) {
            return (JSON_Value *)0x0;
          }
          if ((pbVar3[3] & 0xffffffc0) != 0x80) {
            return (JSON_Value *)0x0;
          }
          uVar6 = pbVar3[3] & 0x3f |
                  (pbVar3[2] & 0x3f | (pbVar3[1] & 0x3f) << 6 | (uVar4 & 7) << 0xc) << 6;
        }
        if ((1 < uVar5) && (uVar6 < 0x80)) {
          return (JSON_Value *)0x0;
        }
        if ((2 < uVar5) && (uVar6 < 0x800)) {
          return (JSON_Value *)0x0;
        }
        if (uVar6 < 0x10000) {
          if (3 < uVar5) {
            return (JSON_Value *)0x0;
          }
        }
        else if (0x10ffff < uVar6) {
          return (JSON_Value *)0x0;
        }
        if ((uVar6 & 0x1ff800) == 0xd800) {
          return (JSON_Value *)0x0;
        }
        pbVar3 = pbVar3 + uVar5;
      } while (pbVar3 < string + length);
    }
    __dest = (char *)(*parson_malloc)(length + 1);
    if (__dest == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      __dest[length] = '\0';
      memcpy(__dest,string,length);
    }
    if (__dest != (char *)0x0) {
      pJVar2 = (JSON_Value *)(*parson_malloc)(0x20);
      if (pJVar2 == (JSON_Value *)0x0) {
        pJVar2 = (JSON_Value *)0x0;
      }
      else {
        pJVar2->parent = (JSON_Value *)0x0;
        pJVar2->type = 2;
        (pJVar2->value).string.chars = __dest;
        (pJVar2->value).string.length = length;
      }
      if (pJVar2 != (JSON_Value *)0x0) {
        return pJVar2;
      }
      (*parson_free)(__dest);
      return (JSON_Value *)0x0;
    }
  }
  return (JSON_Value *)0x0;
}

Assistant:

JSON_Value * json_value_init_string_with_len(const char *string, size_t length) {
    char *copy = NULL;
    JSON_Value *value;
    if (string == NULL) {
        return NULL;
    }
    if (!is_valid_utf8(string, length)) {
        return NULL;
    }
    copy = parson_strndup(string, length);
    if (copy == NULL) {
        return NULL;
    }
    value = json_value_init_string_no_copy(copy, length);
    if (value == NULL) {
        parson_free(copy);
    }
    return value;
}